

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O0

void stbir__encode_uint8_srgb4_linearalpha_ABGR
               (void *outputp,int width_times_channels,float *encode)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  stbir_uint8 sVar20;
  uchar *puVar21;
  bool bVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  float local_7dc;
  ulong uStack_7d8;
  float f;
  __m128i temp_2;
  __m128i temp_1;
  __m128i temp;
  stbir__simdi_u32 temp2;
  stbir__simdi_u32 temp1;
  stbir__simdi_u32 temp0;
  __m128 tmp3;
  __m128 tmp2;
  __m128 tmp1;
  __m128 tmp0;
  __m128i i3;
  __m128i i2;
  __m128i i1;
  __m128i i0;
  __m128 f3;
  __m128 f2;
  __m128 f1;
  __m128 f0;
  float *end_encode_m16;
  uchar *end_output;
  uchar *output;
  float *encode_local;
  int width_times_channels_local;
  void *outputp_local;
  short local_648;
  short sStack_646;
  short sStack_644;
  short sStack_642;
  short local_638;
  short sStack_636;
  short sStack_634;
  short sStack_632;
  short sStack_540;
  short sStack_53e;
  short sStack_53c;
  short sStack_53a;
  short sStack_530;
  short sStack_52e;
  short sStack_52c;
  short sStack_52a;
  undefined4 local_4a8;
  undefined4 uStack_4a4;
  undefined4 local_498;
  undefined4 uStack_494;
  undefined4 local_488;
  undefined4 uStack_484;
  undefined4 local_478;
  undefined4 uStack_474;
  undefined4 uStack_460;
  float fStack_45c;
  undefined4 uStack_450;
  float fStack_44c;
  undefined4 uStack_440;
  float fStack_43c;
  undefined4 uStack_430;
  float fStack_42c;
  uint local_298;
  uint uStack_294;
  uint uStack_290;
  uint uStack_28c;
  uint local_258;
  uint uStack_254;
  uint uStack_250;
  uint uStack_24c;
  uint local_218;
  uint uStack_214;
  uint uStack_210;
  uint uStack_20c;
  uint local_1d8;
  uint uStack_1d4;
  uint uStack_1d0;
  uint uStack_1cc;
  uint local_1b8;
  uint uStack_1b4;
  uint uStack_1b0;
  uint uStack_1ac;
  uint local_198;
  uint uStack_194;
  uint uStack_190;
  uint uStack_18c;
  float local_18;
  float fStack_14;
  float fStack_10;
  float fStack_c;
  
  puVar21 = (uchar *)((long)outputp + (long)width_times_channels);
  end_output = (uchar *)outputp;
  output = (uchar *)encode;
  if (width_times_channels < 0x10) {
    do {
      sVar20 = stbir__linear_to_srgb_uchar(*(float *)output);
      end_output[3] = sVar20;
      sVar20 = stbir__linear_to_srgb_uchar(*(float *)(output + 4));
      end_output[2] = sVar20;
      sVar20 = stbir__linear_to_srgb_uchar(*(float *)(output + 8));
      end_output[1] = sVar20;
      local_7dc = *(float *)(output + 0xc) * 255.0 + 0.5;
      if (local_7dc < 0.0) {
        local_7dc = 0.0;
      }
      if (255.0 < local_7dc) {
        local_7dc = 255.0;
      }
      *end_output = (uchar)(int)local_7dc;
      end_output = end_output + 4;
      output = output + 0x10;
    } while (end_output < puVar21);
  }
  else {
    end_output = (uchar *)outputp;
    output = (uchar *)encode;
    do {
      do {
        local_478 = (undefined4)*(undefined8 *)output;
        uStack_474 = (undefined4)((ulong)*(undefined8 *)output >> 0x20);
        local_488 = (undefined4)*(undefined8 *)(output + 0x10);
        uStack_484 = (undefined4)((ulong)*(undefined8 *)(output + 0x10) >> 0x20);
        local_498 = (undefined4)*(undefined8 *)(output + 0x20);
        uStack_494 = (undefined4)((ulong)*(undefined8 *)(output + 0x20) >> 0x20);
        local_4a8 = (undefined4)*(undefined8 *)(output + 0x30);
        uStack_4a4 = (undefined4)((ulong)*(undefined8 *)(output + 0x30) >> 0x20);
        uStack_430 = (undefined4)*(undefined8 *)(output + 8);
        fStack_42c = (float)((ulong)*(undefined8 *)(output + 8) >> 0x20);
        uStack_440 = (undefined4)*(undefined8 *)(output + 0x18);
        fStack_43c = (float)((ulong)*(undefined8 *)(output + 0x18) >> 0x20);
        uStack_450 = (undefined4)*(undefined8 *)(output + 0x28);
        fStack_44c = (float)((ulong)*(undefined8 *)(output + 0x28) >> 0x20);
        uStack_460 = (undefined4)*(undefined8 *)(output + 0x38);
        fStack_45c = (float)((ulong)*(undefined8 *)(output + 0x38) >> 0x20);
        auVar5._4_4_ = local_488;
        auVar5._0_4_ = local_478;
        auVar5._12_4_ = local_4a8;
        auVar5._8_4_ = local_498;
        auVar3._12_4_ = uStack_4a4;
        auVar3._8_4_ = uStack_494;
        auVar3._4_4_ = uStack_484;
        auVar3._0_4_ = uStack_474;
        auVar1._4_4_ = uStack_440;
        auVar1._0_4_ = uStack_430;
        auVar1._12_4_ = uStack_460;
        auVar1._8_4_ = uStack_450;
        auVar4._8_8_ = 0x3900000039000000;
        auVar4._0_8_ = 0x3900000039000000;
        auVar23 = maxps(auVar5,auVar4);
        auVar9._8_8_ = 0x3f7fffff3f7fffff;
        auVar9._0_8_ = 0x3f7fffff3f7fffff;
        auVar23 = minps(auVar23,auVar9);
        local_198 = auVar23._0_4_;
        uStack_194 = auVar23._4_4_;
        uStack_190 = auVar23._8_4_;
        uStack_18c = auVar23._12_4_;
        auVar2._8_8_ = 0x3900000039000000;
        auVar2._0_8_ = 0x3900000039000000;
        auVar23 = maxps(auVar3,auVar2);
        auVar8._8_8_ = 0x3f7fffff3f7fffff;
        auVar8._0_8_ = 0x3f7fffff3f7fffff;
        auVar23 = minps(auVar23,auVar8);
        local_1b8 = auVar23._0_4_;
        uStack_1b4 = auVar23._4_4_;
        uStack_1b0 = auVar23._8_4_;
        uStack_1ac = auVar23._12_4_;
        auVar24._8_8_ = 0x3900000039000000;
        auVar24._0_8_ = 0x3900000039000000;
        auVar23 = maxps(auVar1,auVar24);
        auVar7._8_8_ = 0x3f7fffff3f7fffff;
        auVar7._0_8_ = 0x3f7fffff3f7fffff;
        auVar23 = minps(auVar23,auVar7);
        local_1d8 = auVar23._0_4_;
        uStack_1d4 = auVar23._4_4_;
        uStack_1d0 = auVar23._8_4_;
        uStack_1cc = auVar23._12_4_;
        i0[1] = CONCAT44(fStack_43c * 255.0 + 0.5,fStack_42c * 255.0 + 0.5);
        f3[0] = fStack_44c * 255.0 + 0.5;
        f3[1] = fStack_45c * 255.0 + 0.5;
        auVar23._8_4_ = f3[0];
        auVar23._12_4_ = f3[1];
        auVar23._0_8_ = i0[1];
        auVar23 = maxps(auVar23,ZEXT816(0));
        auVar6._8_8_ = 0x437f0000437f0000;
        auVar6._0_8_ = 0x437f0000437f0000;
        auVar23 = minps(auVar23,auVar6);
        local_18 = auVar23._0_4_;
        fStack_14 = auVar23._4_4_;
        fStack_10 = auVar23._8_4_;
        fStack_c = auVar23._12_4_;
        tmp0[3] = (float)(int)fStack_14;
        tmp0[2] = (float)(int)local_18;
        i3[0]._0_4_ = (int)fStack_10;
        i3[0]._4_4_ = (int)fStack_c;
        temp1.m128i_u32[3] = (&DAT_009fdfb0)[(int)(uStack_194 >> 0x14)];
        temp1.m128i_u32[2] = (&DAT_009fdfb0)[(int)(local_198 >> 0x14)];
        temp0.m128i_u32[1] = (&DAT_009fdfb0)[(int)(uStack_18c >> 0x14)];
        temp0.m128i_u32[0] = (&DAT_009fdfb0)[(int)(uStack_190 >> 0x14)];
        temp2.m128i_u32[3] = (&DAT_009fdfb0)[(int)(uStack_1b4 >> 0x14)];
        temp2.m128i_u32[2] = (&DAT_009fdfb0)[(int)(local_1b8 >> 0x14)];
        temp1.m128i_u32[1] = (&DAT_009fdfb0)[(int)(uStack_1ac >> 0x14)];
        temp1.m128i_u32[0] = (&DAT_009fdfb0)[(int)(uStack_1b0 >> 0x14)];
        temp[1] = CONCAT44((&DAT_009fdfb0)[(int)(uStack_1d4 >> 0x14)],
                           (&DAT_009fdfb0)[(int)(local_1d8 >> 0x14)]);
        temp2.m128i_u32[1] = (&DAT_009fdfb0)[(int)(uStack_1cc >> 0x14)];
        temp2.m128i_u32[0] = (&DAT_009fdfb0)[(int)(uStack_1d0 >> 0x14)];
        temp_1[1] = CONCAT44(uStack_194 >> 0xc,local_198 >> 0xc);
        temp[0] = CONCAT44(uStack_18c >> 0xc,uStack_190 >> 0xc);
        auVar15._8_8_ = temp0.m128i_i128[0];
        auVar15._0_8_ = temp1.m128i_i128[1];
        auVar14._8_8_ = temp[0] & 0xff000000ffU | 0x200000002000000;
        auVar14._0_8_ = temp_1[1] & 0xff000000ffU | 0x200000002000000;
        auVar23 = pmaddwd(auVar15,auVar14);
        local_218 = auVar23._0_4_;
        uStack_214 = auVar23._4_4_;
        uStack_210 = auVar23._8_4_;
        uStack_20c = auVar23._12_4_;
        i1[1] = CONCAT44(uStack_214 >> 0x10,local_218 >> 0x10);
        i0[0]._0_4_ = uStack_210 >> 0x10;
        i0[0]._4_4_ = uStack_20c >> 0x10;
        temp_2[1] = CONCAT44(uStack_1b4 >> 0xc,local_1b8 >> 0xc);
        temp_1[0] = CONCAT44(uStack_1ac >> 0xc,uStack_1b0 >> 0xc);
        auVar13._8_8_ = temp1.m128i_i128[0];
        auVar13._0_8_ = temp2.m128i_i128[1];
        auVar12._8_8_ = temp_1[0] & 0xff000000ffU | 0x200000002000000;
        auVar12._0_8_ = temp_2[1] & 0xff000000ffU | 0x200000002000000;
        auVar23 = pmaddwd(auVar13,auVar12);
        local_258 = auVar23._0_4_;
        uStack_254 = auVar23._4_4_;
        uStack_250 = auVar23._8_4_;
        uStack_24c = auVar23._12_4_;
        i2[1] = CONCAT44(uStack_254 >> 0x10,local_258 >> 0x10);
        i1[0]._0_4_ = uStack_250 >> 0x10;
        i1[0]._4_4_ = uStack_24c >> 0x10;
        uStack_7d8 = CONCAT44(uStack_1d4 >> 0xc,local_1d8 >> 0xc);
        temp_2[0] = CONCAT44(uStack_1cc >> 0xc,uStack_1d0 >> 0xc);
        auVar11._8_8_ = temp2.m128i_i128[0];
        auVar11._0_8_ = temp[1];
        auVar10._8_8_ = temp_2[0] & 0xff000000ffU | 0x200000002000000;
        auVar10._0_8_ = uStack_7d8 & 0xff000000ff | 0x200000002000000;
        auVar23 = pmaddwd(auVar11,auVar10);
        local_298 = auVar23._0_4_;
        uStack_294 = auVar23._4_4_;
        uStack_290 = auVar23._8_4_;
        uStack_28c = auVar23._12_4_;
        i3[1] = CONCAT44(uStack_294 >> 0x10,local_298 >> 0x10);
        i2[0]._0_4_ = uStack_290 >> 0x10;
        i2[0]._4_4_ = uStack_28c >> 0x10;
        auVar19._8_8_ = i3[0];
        auVar19._0_4_ = (int)local_18;
        auVar19._4_4_ = (int)fStack_14;
        auVar18._8_8_ = i2[0];
        auVar18._0_8_ = i3[1];
        auVar23 = packssdw(auVar19,auVar18);
        auVar17._8_8_ = i1[0];
        auVar17._0_8_ = i2[1];
        auVar16._8_8_ = i0[0];
        auVar16._0_8_ = i1[1];
        auVar24 = packssdw(auVar17,auVar16);
        local_638 = auVar23._0_2_;
        sStack_636 = auVar23._2_2_;
        sStack_634 = auVar23._4_2_;
        sStack_632 = auVar23._6_2_;
        local_648 = auVar24._0_2_;
        sStack_646 = auVar24._2_2_;
        sStack_644 = auVar24._4_2_;
        sStack_642 = auVar24._6_2_;
        sStack_530 = auVar23._8_2_;
        sStack_52e = auVar23._10_2_;
        sStack_52c = auVar23._12_2_;
        sStack_52a = auVar23._14_2_;
        sStack_540 = auVar24._8_2_;
        sStack_53e = auVar24._10_2_;
        sStack_53c = auVar24._12_2_;
        sStack_53a = auVar24._14_2_;
        tmp0[2]._1_1_ = (0 < sStack_530) * (sStack_530 < 0x100) * auVar23[8] - (0xff < sStack_530);
        tmp0[2]._0_1_ = (0 < local_638) * (local_638 < 0x100) * auVar23[0] - (0xff < local_638);
        tmp0[2]._2_1_ = (0 < local_648) * (local_648 < 0x100) * auVar24[0] - (0xff < local_648);
        tmp0[2]._3_1_ = (0 < sStack_540) * (sStack_540 < 0x100) * auVar24[8] - (0xff < sStack_540);
        tmp0[3]._0_1_ = (0 < sStack_636) * (sStack_636 < 0x100) * auVar23[2] - (0xff < sStack_636);
        tmp0[3]._1_1_ = (0 < sStack_52e) * (sStack_52e < 0x100) * auVar23[10] - (0xff < sStack_52e);
        tmp0[3]._2_1_ = (0 < sStack_646) * (sStack_646 < 0x100) * auVar24[2] - (0xff < sStack_646);
        tmp0[3]._3_1_ = (0 < sStack_53e) * (sStack_53e < 0x100) * auVar24[10] - (0xff < sStack_53e);
        i3[0]._0_1_ = (0 < sStack_634) * (sStack_634 < 0x100) * auVar23[4] - (0xff < sStack_634);
        i3[0]._1_1_ = (0 < sStack_52c) * (sStack_52c < 0x100) * auVar23[0xc] - (0xff < sStack_52c);
        i3[0]._2_1_ = (0 < sStack_644) * (sStack_644 < 0x100) * auVar24[4] - (0xff < sStack_644);
        i3[0]._3_1_ = (0 < sStack_53c) * (sStack_53c < 0x100) * auVar24[0xc] - (0xff < sStack_53c);
        i3[0]._4_1_ = (0 < sStack_632) * (sStack_632 < 0x100) * auVar23[6] - (0xff < sStack_632);
        i3[0]._5_1_ = (0 < sStack_52a) * (sStack_52a < 0x100) * auVar23[0xe] - (0xff < sStack_52a);
        i3[0]._6_1_ = (0 < sStack_642) * (sStack_642 < 0x100) * auVar24[6] - (0xff < sStack_642);
        i3[0]._7_1_ = (0 < sStack_53a) * (sStack_53a < 0x100) * auVar24[0xe] - (0xff < sStack_53a);
        *(undefined8 *)end_output = tmp0._8_8_;
        *(longlong *)(end_output + 8) = i3[0];
        end_output = end_output + 0x10;
        output = output + 0x40;
      } while (end_output <= puVar21 + -0x10);
      bVar22 = end_output != puVar21;
      end_output = puVar21 + -0x10;
      output = (uchar *)(encode + (long)width_times_channels + -0x10);
    } while (bVar22);
  }
  return;
}

Assistant:

static void STBIR__CODER_NAME( stbir__encode_uint8_srgb4_linearalpha )( void * outputp, int width_times_channels, float const * encode )
{
  unsigned char STBIR_SIMD_STREAMOUT_PTR( * ) output = (unsigned char*) outputp;
  unsigned char * end_output = ( (unsigned char*) output ) + width_times_channels;

  #ifdef STBIR_SIMD

  if ( width_times_channels >= 16 )
  {
    float const * end_encode_m16 = encode + width_times_channels - 16;
    end_output -= 16;
    STBIR_SIMD_NO_UNROLL_LOOP_START_INF_FOR
    for(;;)
    {
      stbir__simdf f0, f1, f2, f3;
      stbir__simdi i0, i1, i2, i3;

      STBIR_SIMD_NO_UNROLL(encode);
      stbir__simdf_load4_transposed( f0, f1, f2, f3, encode );

      stbir__min_max_shift20( i0, f0 );
      stbir__min_max_shift20( i1, f1 );
      stbir__min_max_shift20( i2, f2 );
      stbir__scale_and_convert( i3, f3 );

      stbir__simdi_table_lookup3( i0, i1, i2, ( fp32_to_srgb8_tab4 - (127-13)*8 ) );

      stbir__linear_to_srgb_finish( i0, f0 );
      stbir__linear_to_srgb_finish( i1, f1 );
      stbir__linear_to_srgb_finish( i2, f2 );

      stbir__interleave_pack_and_store_16_u8( output,  STBIR_strs_join1(i, ,stbir__encode_order0), STBIR_strs_join1(i, ,stbir__encode_order1), STBIR_strs_join1(i, ,stbir__encode_order2), STBIR_strs_join1(i, ,stbir__encode_order3) );

      output += 16;
      encode += 16;

      if ( output <= end_output )
        continue;
      if ( output == ( end_output + 16 ) )
        break;
      output = end_output; // backup and do last couple
      encode = end_encode_m16;
    }
    return;
  }
  #endif

  STBIR_SIMD_NO_UNROLL_LOOP_START
  do {
    float f;
    STBIR_SIMD_NO_UNROLL(encode);

    output[stbir__decode_order0] = stbir__linear_to_srgb_uchar( encode[0] );
    output[stbir__decode_order1] = stbir__linear_to_srgb_uchar( encode[1] );
    output[stbir__decode_order2] = stbir__linear_to_srgb_uchar( encode[2] );

    f = encode[3] * stbir__max_uint8_as_float + 0.5f;
    STBIR_CLAMP(f, 0, 255);
    output[stbir__decode_order3] = (unsigned char) f;

    output += 4;
    encode += 4;
  } while( output < end_output );
}